

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner_ctx.h
# Opt level: O2

void __thiscall ScannerCtx::ScannerCtx(ScannerCtx *this)

{
  this->isBracketArg = false;
  this->bracketsLength = 0;
  (this->stringLiteral).literal._M_dataplus._M_p = (pointer)&(this->stringLiteral).literal.field_2;
  (this->stringLiteral).literal._M_string_length = 0;
  (this->stringLiteral).literal.field_2._M_local_buf[0] = '\0';
  (this->stringLiteral).isId = true;
  yy::parser::basic_symbol<yy::parser::by_kind>::basic_symbol
            (&(this->nextToken).super_basic_symbol<yy::parser::by_kind>);
  (this->location).begin.filename = (filename_type *)0x0;
  (this->location).begin.line = 1;
  (this->location).begin.column = 1;
  (this->location).end.filename = (filename_type *)0x0;
  (this->location).end.line = 1;
  (this->location).end.column = 1;
  (this->filepath)._M_dataplus._M_p = (pointer)&(this->filepath).field_2;
  (this->filepath)._M_string_length = 0;
  (this->filepath).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

void SetInputFile(const std::string path)
    {
        filepath = path;
        location.initialize(&filepath);
    }